

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

double GetDynamicLengths(ZopfliLZ77Store *lz77,size_t lstart,size_t lend,uint *ll_lengths,
                        uint *d_lengths)

{
  long lVar1;
  uint *puVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  byte bVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  size_t d_counts [32];
  size_t d_counts2 [32];
  uint ll_lengths2 [288];
  size_t ll_counts [288];
  size_t ll_counts2 [288];
  uint local_1938 [32];
  size_t local_18b8 [32];
  size_t local_17b8 [32];
  uint local_16b8 [288];
  size_t local_1238 [256];
  undefined8 local_a38;
  size_t local_938 [289];
  
  bVar8 = 0;
  ZopfliLZ77GetHistogram(lz77,lstart,lend,local_1238,local_18b8);
  local_a38 = 1;
  ZopfliCalculateBitLengths(local_1238,0x120,0xf,ll_lengths);
  ZopfliCalculateBitLengths(local_18b8,0x20,0xf,d_lengths);
  lVar1 = 0;
  uVar7 = 0;
  do {
    uVar7 = (uVar7 + 1) - (uint)(d_lengths[lVar1] == 0);
    if (1 < uVar7) goto LAB_001030b5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1e);
  if (uVar7 == 0) {
    d_lengths[1] = 1;
    puVar2 = d_lengths;
  }
  else {
    puVar2 = d_lengths + (*d_lengths != 0);
  }
  *puVar2 = 1;
LAB_001030b5:
  sVar3 = CalculateTreeSize(ll_lengths,d_lengths);
  auVar10._8_4_ = (int)(sVar3 >> 0x20);
  auVar10._0_8_ = sVar3;
  auVar10._12_4_ = 0x45300000;
  sVar4 = CalculateBlockSymbolSizeGivenCounts
                    (local_1238,local_18b8,ll_lengths,d_lengths,lz77,lstart,lend);
  auVar11._8_4_ = (int)(sVar4 >> 0x20);
  auVar11._0_8_ = sVar4;
  auVar11._12_4_ = 0x45300000;
  memcpy(local_938,local_1238,0x900);
  memcpy(local_17b8,local_18b8,0x100);
  OptimizeHuffmanForRle(0x120,local_938);
  OptimizeHuffmanForRle(0x20,local_17b8);
  ZopfliCalculateBitLengths(local_938,0x120,0xf,local_16b8);
  puVar2 = local_1938;
  ZopfliCalculateBitLengths(local_17b8,0x20,0xf,puVar2);
  lVar1 = 0;
  uVar7 = 0;
  do {
    uVar7 = (uVar7 + 1) - (uint)(local_1938[lVar1] == 0);
    if (1 < uVar7) goto LAB_001031fc;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1e);
  if (uVar7 == 0) {
    local_1938[1] = 1;
  }
  else {
    puVar2 = local_1938 + (local_1938[0] != 0);
  }
  *puVar2 = 1;
LAB_001031fc:
  sVar5 = CalculateTreeSize(local_16b8,local_1938);
  auVar12._8_4_ = (int)(sVar5 >> 0x20);
  auVar12._0_8_ = sVar5;
  auVar12._12_4_ = 0x45300000;
  sVar6 = CalculateBlockSymbolSizeGivenCounts
                    (local_1238,local_18b8,local_16b8,local_1938,lz77,lstart,lend);
  auVar13._8_4_ = (int)(sVar6 >> 0x20);
  auVar13._0_8_ = sVar6;
  auVar13._12_4_ = 0x45300000;
  dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0) +
           (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
  dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
          (auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0);
  if (dVar14 < dVar9) {
    memcpy(ll_lengths,local_16b8,0x480);
    puVar2 = local_1938;
    for (lVar1 = 0x20; dVar9 = dVar14, lVar1 != 0; lVar1 = lVar1 + -1) {
      *d_lengths = *puVar2;
      puVar2 = puVar2 + (ulong)bVar8 * -2 + 1;
      d_lengths = d_lengths + (ulong)bVar8 * -2 + 1;
    }
  }
  return dVar9;
}

Assistant:

static double GetDynamicLengths(const ZopfliLZ77Store* lz77,
                                size_t lstart, size_t lend,
                                unsigned* ll_lengths, unsigned* d_lengths) {
  size_t ll_counts[ZOPFLI_NUM_LL];
  size_t d_counts[ZOPFLI_NUM_D];

  ZopfliLZ77GetHistogram(lz77, lstart, lend, ll_counts, d_counts);
  ll_counts[256] = 1;  /* End symbol. */
  ZopfliCalculateBitLengths(ll_counts, ZOPFLI_NUM_LL, 15, ll_lengths);
  ZopfliCalculateBitLengths(d_counts, ZOPFLI_NUM_D, 15, d_lengths);
  PatchDistanceCodesForBuggyDecoders(d_lengths);
  return TryOptimizeHuffmanForRle(
      lz77, lstart, lend, ll_counts, d_counts, ll_lengths, d_lengths);
}